

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

reference __thiscall
slang::SmallVectorBase<std::basic_string_view<char,std::char_traits<char>>>::
emplace_back<std::basic_string_view<char,std::char_traits<char>>>
          (SmallVectorBase<std::basic_string_view<char,_std::char_traits<char>_>_> *this,
          basic_string_view<char,_std::char_traits<char>_> *args)

{
  iterator pbVar1;
  size_t *in_RSI;
  SmallVectorBase<std::basic_string_view<char,_std::char_traits<char>_>_> *in_RDI;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_00000020;
  pointer in_stack_00000028;
  SmallVectorBase<std::basic_string_view<char,_std::char_traits<char>_>_> *in_stack_00000030;
  pointer local_8;
  
  if (in_RDI->len == in_RDI->cap) {
    SmallVectorBase<std::basic_string_view<char,_std::char_traits<char>_>_>::end(in_RDI);
    local_8 = emplaceRealloc<std::basic_string_view<char,std::char_traits<char>>>
                        (in_stack_00000030,in_stack_00000028,in_stack_00000020);
  }
  else {
    pbVar1 = SmallVectorBase<std::basic_string_view<char,_std::char_traits<char>_>_>::end(in_RDI);
    pbVar1->_M_len = *in_RSI;
    pbVar1->_M_str = (char *)in_RSI[1];
    in_RDI->len = in_RDI->len + 1;
    local_8 = SmallVectorBase<std::basic_string_view<char,_std::char_traits<char>_>_>::back(in_RDI);
  }
  return local_8;
}

Assistant:

reference emplace_back(Args&&... args) {
        if (len == cap)
            return *emplaceRealloc(end(), std::forward<Args>(args)...);

        new (end()) T(std::forward<Args>(args)...);
        len++;
        return back();
    }